

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

void show_obj(wchar_t obj_num,wchar_t row,wchar_t col,_Bool cursor,olist_detail_t mode)

{
  object_menu_data *__s;
  byte bVar1;
  object *obj;
  loc grid;
  _Bool _Var2;
  int16_t iVar3;
  wchar_t row_00;
  uint uVar4;
  wchar_t wVar5;
  int iVar6;
  size_t sVar7;
  class_book *pcVar8;
  store_conflict *store;
  uint uVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  char *__s_00;
  uint8_t uVar11;
  wchar_t wVar12;
  char buf [80];
  int local_98;
  char local_88 [88];
  
  uVar11 = '\x0e';
  if ((int)CONCAT71(in_register_00000009,cursor) == 0) {
    uVar11 = '\x01';
  }
  __s = items + obj_num;
  obj = items[obj_num].object;
  if ((mode & (OLIST_DEATH|OLIST_WINDOW)) == OLIST_NONE) {
    iVar6 = 0;
  }
  else {
    sVar7 = strlen(__s->label);
    iVar6 = (int)sVar7;
  }
  sVar7 = strlen(items[obj_num].equip_label);
  row_00 = row + obj_num;
  wVar12 = L'\x01';
  if (L'\x01' < col) {
    wVar12 = col;
  }
  prt("",row_00,wVar12 + L'\xffffffff');
  if (__s->label[0] != '\0') {
    if ((mode & (OLIST_DEATH|OLIST_WINDOW)) != OLIST_NONE) {
      c_put_str(uVar11,__s->label,row_00,col);
    }
    wVar12 = col + iVar6;
    c_put_str(uVar11,items[obj_num].equip_label,row_00,wVar12);
    local_98 = (int)sVar7;
    __s_00 = items[obj_num].o_name;
    sVar7 = strlen(__s_00);
    if ((ulong)(long)ex_offset < sVar7 + (long)(iVar6 + local_98)) {
      uVar9 = ex_offset - (iVar6 + local_98);
      uVar4 = 0;
      if (0 < (int)uVar9) {
        uVar4 = uVar9;
      }
      uVar10 = 0x4f;
      if ((int)uVar4 < 0x4f) {
        uVar10 = (ulong)uVar4;
      }
      __s_00[uVar10] = '\0';
    }
    if (obj == (object *)0x0) {
      c_put_str('\x02',__s_00,row_00,wVar12 + local_98);
      return;
    }
    uVar11 = (uint8_t)obj->kind->base->attr;
    _Var2 = tval_is_book_k(obj->kind);
    if ((_Var2) && (pcVar8 = player_object_to_book(player,obj), pcVar8 == (class_book *)0x0)) {
      uVar11 = '\x02';
    }
    c_put_str(uVar11,__s_00,row_00,wVar12 + local_98);
    wVar12 = ex_offset;
    if (((mode & OLIST_PRICE) != OLIST_NONE) &&
       (grid.x = (player->grid).x, grid.y = (player->grid).y, store = store_at((chunk *)cave,grid),
       store != (store_conflict *)0x0)) {
      wVar5 = price_item(store,obj,true,(uint)obj->number);
      strnfmt(local_88,0x50,"%6d au",(ulong)(uint)wVar5);
      put_str(local_88,row_00,wVar12 + col);
      wVar12 = wVar12 + L'\t';
    }
    if (((mode & OLIST_FAIL) != OLIST_NONE) && (_Var2 = obj_can_fail(obj), _Var2)) {
      wVar5 = get_use_device_chance(obj);
      _Var2 = object_effect_is_known(obj);
      if (_Var2) {
        strnfmt(local_88,0x50,"%4d%% fail",(ulong)(uint)((wVar5 + L'\t') / 10));
      }
      else {
        my_strcpy(local_88,"    ? fail",0x50);
      }
      put_str(local_88,row_00,wVar12 + col);
      wVar12 = wVar12 + L'\n';
    }
    if ((mode >> 8 & 1) != 0) {
      wVar5 = recharge_failure_chance(obj,player->upkeep->recharge_pow);
      _Var2 = object_effect_is_known(obj);
      if (_Var2) {
        iVar6 = (int)(1000 / (long)wVar5);
        strnfmt(local_88,0x50,"%2d.%1d%% fail",(ulong)(uint)(iVar6 / 10),(ulong)(uint)(iVar6 % 10));
      }
      else {
        my_strcpy(local_88,"    ? fail",0x50);
      }
      put_str(local_88,row_00,wVar12 + col);
      wVar12 = wVar12 + L'\n';
    }
    if ((mode & OLIST_WEIGHT) != OLIST_NONE) {
      bVar1 = obj->number;
      iVar3 = object_weight_one(obj);
      iVar6 = (int)iVar3 * (uint)bVar1;
      strnfmt(local_88,0x50,"%4d.%1d lb",(ulong)(uint)(iVar6 / 10),(ulong)(uint)(iVar6 % 10));
      put_str(local_88,row_00,wVar12 + col);
    }
  }
  return;
}

Assistant:

static void show_obj(int obj_num, int row, int col, bool cursor,
					 olist_detail_t mode)
{
	int attr;
	int label_attr = cursor ? COLOUR_L_BLUE : COLOUR_WHITE;
	int ex_offset_ctr;
	char buf[80];
	struct object *obj = items[obj_num].object;
	bool show_label = mode & (OLIST_WINDOW | OLIST_DEATH) ? true : false;
	int label_size = show_label ? strlen(items[obj_num].label) : 0;
	int equip_label_size = strlen(items[obj_num].equip_label);

	/* Clear the line */
	prt("", row + obj_num, MAX(col - 1, 0));

	/* If we have no label then we won't display anything */
	if (!strlen(items[obj_num].label)) return;

	/* Print the label */
	if (show_label)
		c_put_str(label_attr, items[obj_num].label, row + obj_num, col);

	/* Print the equipment label */
	c_put_str(label_attr, items[obj_num].equip_label, row + obj_num,
			  col + label_size);

	/* Limit object name */
	if (label_size + equip_label_size + strlen(items[obj_num].o_name) >
		(size_t)ex_offset) {
		int truncate = ex_offset - label_size - equip_label_size;

		if (truncate < 0) truncate = 0;
		if ((size_t)truncate > sizeof(items[obj_num].o_name) - 1)
			truncate = sizeof(items[obj_num].o_name) - 1;

		items[obj_num].o_name[truncate] = '\0';
	}

	/* Item kind determines the color of the output */
	if (obj) {
		attr = obj->kind->base->attr;

		/* Unreadable books are a special case */
		if (tval_is_book_k(obj->kind) &&
			(player_object_to_book(player, obj) == NULL)) {
			attr = COLOUR_SLATE;
		}
	} else {
		attr = COLOUR_SLATE;
	}

	/* Object name */
	c_put_str(attr, items[obj_num].o_name, row + obj_num,
			  col + label_size + equip_label_size);

	/* If we don't have an object, we can skip the rest of the output */
	if (!obj) return;

	/* Extra fields */
	ex_offset_ctr = ex_offset;

	/* Price */
	if (mode & OLIST_PRICE) {
		struct store *store = store_at(cave, player->grid);
		if (store) {
			int price = price_item(store, obj, true, obj->number);

			strnfmt(buf, sizeof(buf), "%6d au", price);
			put_str(buf, row + obj_num, col + ex_offset_ctr);
			ex_offset_ctr += 9;
		}
	}

	/* Failure chance for magic devices and activations */
	if (mode & OLIST_FAIL && obj_can_fail(obj)) {
		int fail = (9 + get_use_device_chance(obj)) / 10;
		if (object_effect_is_known(obj))
			strnfmt(buf, sizeof(buf), "%4d%% fail", fail);
		else
			my_strcpy(buf, "    ? fail", sizeof(buf));
		put_str(buf, row + obj_num, col + ex_offset_ctr);
		ex_offset_ctr += 10;
	}

	/* Failure chances for recharging an item; see effect_handler_RECHARGE */
	if (mode & OLIST_RECHARGE) {
		int fail = 1000 / recharge_failure_chance(obj, player->upkeep->recharge_pow);
		if (object_effect_is_known(obj))
			strnfmt(buf, sizeof(buf), "%2d.%1d%% fail", fail / 10, fail % 10);
		else
			my_strcpy(buf, "    ? fail", sizeof(buf));
		put_str(buf, row + obj_num, col + ex_offset_ctr);
		ex_offset_ctr += 10;
	}

	/* Weight */
	if (mode & OLIST_WEIGHT) {
		int weight = obj->number * object_weight_one(obj);
		strnfmt(buf, sizeof(buf), "%4d.%1d lb", weight / 10, weight % 10);
		put_str(buf, row + obj_num, col + ex_offset_ctr);
	}
}